

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

StringRef __thiscall
Catch::Generators::GeneratorUntypedBase::currentElementAsString(GeneratorUntypedBase *this)

{
  ulong uVar1;
  StringRef *in_RDI;
  string *in_stack_ffffffffffffffb8;
  string local_38 [40];
  StringRef local_10;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    (**(code **)(in_RDI->m_start + 8))(local_38);
    std::__cxx11::string::operator=((string *)&in_RDI->m_size,local_38);
    std::__cxx11::string::~string(local_38);
  }
  StringRef::StringRef(in_RDI,in_stack_ffffffffffffffb8);
  return local_10;
}

Assistant:

StringRef GeneratorUntypedBase::currentElementAsString() const {
            if ( m_stringReprCache.empty() ) {
                m_stringReprCache = stringifyImpl();
            }
            return m_stringReprCache;
        }